

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.h
# Opt level: O0

BasicStringView<const_char> __thiscall
Corrade::Containers::BasicStringView<const_char>::slice
          (BasicStringView<const_char> *this,size_t begin,size_t end)

{
  ulong uVar1;
  anon_class_24_3_cb5dd4a3 local_48;
  size_t local_30;
  size_t end_local;
  size_t begin_local;
  BasicStringView<const_char> *this_local;
  
  local_30 = end;
  end_local = begin;
  begin_local = (size_t)this;
  if ((end < begin) || ((this->_sizePlusFlags & 0x3fffffffffffffff) < end)) {
    local_48.begin = &end_local;
    local_48.end = &local_30;
    local_48.this = this;
    slice::anon_class_24_3_cb5dd4a3::operator()(&local_48);
  }
  uVar1 = this->_sizePlusFlags;
  BasicStringView((BasicStringView<const_char> *)&this_local,this->_data + end_local,
                  local_30 - end_local | uVar1 & 0x8000000000000000 |
                  (uVar1 & 0x4000000000000000) * (ulong)(local_30 == (uVar1 & 0x3fffffffffffffff)),
                  (nullptr_t)0x0);
  return _this_local;
}

Assistant:

constexpr BasicStringView<T> BasicStringView<T>::slice(const std::size_t begin, const std::size_t end) const {
    return CORRADE_CONSTEXPR_DEBUG_ASSERT(begin <= end && end <= (_sizePlusFlags & ~Implementation::StringViewSizeMask),
            "Containers::StringView::slice(): slice ["
            << Utility::Debug::nospace << begin
            << Utility::Debug::nospace << ":"
            << Utility::Debug::nospace << end
            << Utility::Debug::nospace << "] out of range for"
            << (_sizePlusFlags & ~Implementation::StringViewSizeMask) << "elements"),
        BasicStringView<T>{_data + begin, (end - begin)|
            /* Propagate the global flag always */
            (_sizePlusFlags & std::size_t(StringViewFlag::Global))|
            /* The null termination flag only if the original is
               null-terminated and end points to the original end */
            ((_sizePlusFlags & std::size_t(StringViewFlag::NullTerminated))*(end == (_sizePlusFlags & ~Implementation::StringViewSizeMask))),
            /* Using an internal assert-less constructor, the public
               constructor asserts would be redundant */
            nullptr};
}